

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O1

void __thiscall
pstore::exchange::import_ns::fragment_sections::fragment_sections
          (fragment_sections *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction
          ,not_null<const_string_mapping_*> names,not_null<const_index::digest_*> digest)

{
  uchar *puVar1;
  long lVar2;
  
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__fragment_sections_0015d0b8;
  (this->transaction_).ptr_ = transaction.ptr_;
  (this->names_).ptr_ = names.ptr_;
  (this->digest_).ptr_ = digest.ptr_;
  lVar2 = 0;
  do {
    puVar1 = (this->contents_)._M_elems[0].data.small_buffer_._M_elems + lVar2 + -0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\x01';
    memset(puVar1 + 8,0,0xa0);
    *(uchar **)(puVar1 + 0xa8) = (this->contents_)._M_elems[0].data.small_buffer_._M_elems + lVar2;
    *(undefined8 *)(puVar1 + 0xb0) = 0;
    *(undefined8 *)(puVar1 + 0xb8) = 0;
    *(undefined8 *)(puVar1 + 0xc0) = 0;
    *(undefined8 *)(puVar1 + 200) = 0;
    *(undefined8 *)(puVar1 + 0xd0) = 0;
    *(undefined8 *)(puVar1 + 0xd8) = 0;
    lVar2 = lVar2 + 0xe0;
  } while (lVar2 != 0x10a0);
  (this->dispatchers_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dispatchers_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->linked_definitions_).
  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dispatchers_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->linked_definitions_).
  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->linked_definitions_).
  super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oit_).container = &this->dispatchers_;
  if ((transaction.ptr_)->db_ == ((ctxt.ptr_)->db).ptr_) {
    return;
  }
  assert_failed("&transaction->db () == ctxt->db",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                ,0x6c);
}

Assistant:

fragment_sections::fragment_sections (not_null<context *> const ctxt,
                                                  not_null<transaction_base *> const transaction,
                                                  not_null<string_mapping const *> const names,
                                                  not_null<index::digest const *> const digest)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names}
                    , digest_{digest}
                    , oit_{dispatchers_} {
                PSTORE_ASSERT (&transaction->db () == ctxt->db);
            }